

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> * __thiscall
embree::XMLLoader::
loadBinary<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
          (XMLLoader *this,Ref<embree::XML> *xml)

{
  runtime_error *prVar1;
  char *pcVar2;
  long __off;
  size_t sVar3;
  Vec3fx *pVVar4;
  size_t sVar5;
  undefined8 *in_RDX;
  long in_RSI;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *in_RDI;
  size_t size;
  size_t ofs;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *data;
  size_t i_2;
  size_t i_1;
  size_t i;
  FileName *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffcd0;
  XML *in_stack_fffffffffffffcd8;
  string local_2a0 [38];
  undefined1 local_27a;
  undefined1 local_279;
  string local_258 [39];
  undefined1 local_231 [33];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  size_t local_1a8;
  allocator local_199;
  string local_198 [32];
  string local_178 [32];
  long local_158;
  undefined1 local_14d;
  string local_100 [32];
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  size_t local_48;
  ulong local_30;
  size_t local_28;
  Vec3fx *local_18;
  size_t local_10;
  
  if (*(long *)(in_RSI + 0x20) == 0) {
    local_14d = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_(in_stack_fffffffffffffc88);
    std::operator+((char *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::operator+(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::runtime_error::runtime_error(prVar1,local_100);
    local_14d = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_e0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"ofs",&local_199);
  XML::parm(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __off = atol(pcVar2);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_158 = __off;
  fseek(*(FILE **)(in_RSI + 0x20),__off,0);
  local_c0 = local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"size",&local_1e9);
  XML::parm(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar3 = atol(pcVar2);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1a8 = sVar3;
  if (sVar3 == 0) {
    local_c8 = local_e0;
    in_stack_fffffffffffffcd0 = (string *)*local_e0;
    in_stack_fffffffffffffcd8 = (XML *)local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_231 + 1),"num",(allocator *)in_stack_fffffffffffffcd8);
    XML::parm(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_1a8 = atol(pcVar2);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string((string *)(local_231 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_231);
  }
  if (*(ulong *)(in_RSI + 0x48) < local_158 + local_1a8 * 0x10) {
    local_279 = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_(in_stack_fffffffffffffc88);
    std::operator+((char *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::runtime_error::runtime_error(prVar1,local_258);
    local_279 = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_27a = 0;
  local_48 = local_1a8;
  in_RDI->size_active = 0;
  in_RDI->size_alloced = 0;
  in_RDI->items = (Vec3fx *)0x0;
  local_28 = local_1a8;
  if (local_1a8 != 0) {
    local_10 = local_1a8;
    pVVar4 = (Vec3fx *)
             alignedMalloc((size_t)in_stack_fffffffffffffc98,(size_t)in_stack_fffffffffffffc90);
    in_RDI->items = pVVar4;
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      local_18 = in_RDI->items + local_30;
    }
    in_RDI->size_active = local_28;
    in_RDI->size_alloced = local_28;
  }
  sVar3 = local_1a8;
  sVar5 = fread(in_RDI->items,0x10,in_RDI->size_active,*(FILE **)(in_RSI + 0x20));
  if (sVar3 != sVar5) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    embree::FileName::str_abi_cxx11_(in_stack_fffffffffffffc88);
    std::operator+((char *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::runtime_error::runtime_error(prVar1,local_2a0);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RDI;
}

Assistant:

Vector XMLLoader::loadBinary(const Ref<XML>& xml)
  {
    if (!binFile) 
      THROW_RUNTIME_ERROR("cannot open file "+binFileName.str()+" for reading");

    size_t ofs = atol(xml->parm("ofs").c_str());
    fseek(binFile,long(ofs),SEEK_SET);

    /* read size of array */
    size_t size = atol(xml->parm("size").c_str());
    if (size == 0) size = atol(xml->parm("num").c_str()); // version for BGF format

    /* perform security check that we stay in the file */
    if (ofs + size*sizeof(typename Vector::value_type) > binFileSize)
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    /* read data from file */
    Vector data(size);
    if (size != fread(data.data(), sizeof(typename Vector::value_type), data.size(), binFile)) 
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    return data;
  }